

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O3

WasmSplitOptions * __thiscall
wasm::WasmSplitOptions::add
          (WasmSplitOptions *this,string *longName,string *shortName,string *description,
          string *category,
          vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *modes
          ,Arguments arguments,Action *action)

{
  Mode MVar1;
  pointer pMVar2;
  pointer pcVar3;
  WasmSplitOptions *pWVar4;
  ostream *o;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  pointer pMVar5;
  stringstream local_268 [8];
  stringstream desc;
  ostream local_258 [112];
  ios_base local_1e8 [264];
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_e0 [2];
  long local_d0 [2];
  string *local_c0;
  string *local_b8;
  string *local_b0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_a8;
  undefined8 uStack_a0;
  code *local_98;
  code *pcStack_90;
  WasmSplitOptions *local_88;
  undefined1 local_80 [8];
  string sep;
  long local_58;
  long local_50 [2];
  WasmSplitOptions *local_40;
  string *local_38;
  
  local_38 = longName;
  std::__cxx11::stringstream::stringstream(local_268);
  if ((modes->
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (modes->
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_80[0] = 0x5b;
    std::__ostream_insert<char,std::char_traits<char>>(local_258,local_80,1);
    local_80 = (undefined1  [8])&sep._M_string_length;
    local_c0 = category;
    local_b8 = shortName;
    local_b0 = description;
    local_88 = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"");
    pWVar4 = local_88;
    pMVar5 = (modes->
             super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pMVar2 = (modes->
             super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar5 != pMVar2) {
      do {
        MVar1 = *pMVar5;
        local_e0[0] = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                       *)((pWVar4->validOptions)._M_elems + (long)(ulong)MVar1);
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  (local_e0[0],local_38,local_e0);
        o = std::__ostream_insert<char,std::char_traits<char>>
                      (local_258,(char *)local_80,(long)sep._M_dataplus._M_p);
        anon_unknown_11::operator<<(o,(Mode *)(ulong)MVar1);
        std::__cxx11::string::_M_replace((ulong)local_80,0,sep._M_dataplus._M_p,0x12338b);
        pMVar5 = pMVar5 + 1;
      } while (pMVar5 != pMVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_258,"] ",2);
    this = local_88;
    description = local_b0;
    shortName = local_b8;
    category = local_c0;
    if (local_80 != (undefined1  [8])&sep._M_string_length) {
      operator_delete((void *)local_80,sep._M_string_length + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_258,(description->_M_dataplus)._M_p,description->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_80,action);
  pcVar3 = (local_38->_M_dataplus)._M_p;
  sep.field_2._8_8_ = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&sep.field_2 + 8),pcVar3,pcVar3 + local_38->_M_string_length);
  local_a8 = (function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)0x0;
  uStack_a0 = 0;
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_40 = this;
  this_00 = (function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)operator_new(0x48);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(this_00,(function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_80);
  *(_Manager_type **)&this_00[1].super__Function_base._M_functor =
       &this_00[1].super__Function_base._M_manager;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this_00 + 1),sep.field_2._8_8_,local_58 + sep.field_2._8_8_);
  *(WasmSplitOptions **)&this_00[2].super__Function_base._M_functor = local_40;
  pcStack_90 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:408:5)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:408:5)>
             ::_M_manager;
  local_a8 = this_00;
  wasm::Options::add((string *)&(this->super_ToolOptions).super_Options,(string *)local_38,
                     (string *)shortName,(string *)local_e0,(Arguments)category,
                     (function *)(ulong)arguments,SUB81(&local_a8,0));
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if ((long *)sep.field_2._8_8_ != local_50) {
    operator_delete((void *)sep.field_2._8_8_,local_50[0] + 1);
  }
  if (sep._M_string_length != 0) {
    (*(code *)sep._M_string_length)(local_80,local_80,3);
  }
  if (local_e0[0] !=
      (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
       *)local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_268);
  std::ios_base::~ios_base(local_1e8);
  return this;
}

Assistant:

WasmSplitOptions& WasmSplitOptions::add(const std::string& longName,
                                        const std::string& shortName,
                                        const std::string& description,
                                        const std::string& category,
                                        std::vector<Mode>&& modes,
                                        Arguments arguments,
                                        const Action& action) {
  // Insert the valid modes at the beginning of the description.
  std::stringstream desc;
  if (modes.size()) {
    desc << '[';
    std::string sep = "";
    for (Mode m : modes) {
      validOptions[static_cast<unsigned>(m)].insert(longName);
      desc << sep << m;
      sep = ", ";
    }
    desc << "] ";
  }
  desc << description;
  ToolOptions::add(
    longName,
    shortName,
    desc.str(),
    category,
    arguments,
    [&, action, longName](Options* o, const std::string& argument) {
      usedOptions.push_back(longName);
      action(o, argument);
    });
  return *this;
}